

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall BMP::buildingCodeHuffman(BMP *this)

{
  Alphabet *pAVar1;
  GreyCount *pGVar2;
  HuffmanTree *node;
  HuffmanTree *pHVar3;
  long lVar4;
  int i;
  long lVar5;
  allocator local_79;
  string code;
  priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_toshiks[P]Compression_algorithms_files_cpp:185:17)>
  local_58;
  
  local_58.c.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  code._M_dataplus._M_p = (pointer)0x0;
  code._M_string_length = 0;
  code.field_2._M_allocated_capacity = 0;
  std::_Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>::~_Vector_base
            ((_Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_> *)&code);
  lVar4 = 0x60;
  for (lVar5 = 0; pAVar1 = this->alphabet, lVar5 < pAVar1->num; lVar5 = lVar5 + 1) {
    code._M_dataplus._M_p = (pointer)operator_new(0x30);
    pGVar2 = pAVar1->symbol;
    *(unkbyte10 *)code._M_dataplus._M_p = *(unkbyte10 *)((long)pGVar2 + lVar4 + -0x50);
    *(int *)(code._M_dataplus._M_p + 0x10) = (int)lVar5;
    code._M_dataplus._M_p[0x18] = '\0';
    code._M_dataplus._M_p[0x19] = '\0';
    code._M_dataplus._M_p[0x1a] = '\0';
    code._M_dataplus._M_p[0x1b] = '\0';
    code._M_dataplus._M_p[0x1c] = '\0';
    code._M_dataplus._M_p[0x1d] = '\0';
    code._M_dataplus._M_p[0x1e] = '\0';
    code._M_dataplus._M_p[0x1f] = '\0';
    code._M_dataplus._M_p[0x20] = '\0';
    code._M_dataplus._M_p[0x21] = '\0';
    code._M_dataplus._M_p[0x22] = '\0';
    code._M_dataplus._M_p[0x23] = '\0';
    code._M_dataplus._M_p[0x24] = '\0';
    code._M_dataplus._M_p[0x25] = '\0';
    code._M_dataplus._M_p[0x26] = '\0';
    code._M_dataplus._M_p[0x27] = '\0';
    std::__cxx11::string::assign((char *)((long)&pGVar2->num + lVar4));
    std::
    priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
    ::push(&local_58,(value_type *)&code);
    lVar4 = lVar4 + 0x80;
  }
  while (node = *local_58.c.
                 super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        8 < (ulong)((long)local_58.c.
                          super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58.c.
                         super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
    std::
    priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
    ::pop(&local_58);
    pHVar3 = *local_58.c.
              super__Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::
    priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
    ::pop(&local_58);
    code._M_dataplus._M_p = (pointer)operator_new(0x30);
    *(HuffmanTree **)((long)code._M_dataplus._M_p + 0x18) = node;
    *(HuffmanTree **)((long)code._M_dataplus._M_p + 0x20) = pHVar3;
    *(longdouble *)code._M_dataplus._M_p = pHVar3->frq + node->frq;
    *(undefined4 *)((long)code._M_dataplus._M_p + 0x10) = 0xffffffff;
    std::
    priority_queue<bitMap::HuffmanTree_*,_std::vector<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/toshiks[P]Compression-algorithms/files.cpp:185:17)>
    ::push(&local_58,(value_type *)&code);
  }
  std::__cxx11::string::string((string *)&code,"",&local_79);
  fun(this,node,&code);
  del(node);
  std::__cxx11::string::~string((string *)&code);
  std::_Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_>::~_Vector_base
            ((_Vector_base<bitMap::HuffmanTree_*,_std::allocator<bitMap::HuffmanTree_*>_> *)
             &local_58);
  return;
}

Assistant:

void BMP::buildingCodeHuffman()
{
    using namespace bitMap;
    using namespace std;

    auto comp = []( HuffmanTree *a, HuffmanTree*b ){ return a->frq > b->frq; };

    priority_queue< HuffmanTree*, vector< HuffmanTree* >, decltype( comp ) > qu(comp);

    for ( auto i = 0; i < alphabet->num; i++ ){
        HuffmanTree *obj = new HuffmanTree( alphabet->symbol[ i ].frq, i, nullptr, nullptr );
        alphabet->symbol[ i ].codeHuffman = "";
        qu.push( obj );
    }


    while( qu.size() > 1 ){
        HuffmanTree *l = qu.top();
        qu.pop();
        HuffmanTree *r = qu.top();
        qu.pop();

        HuffmanTree *root = new HuffmanTree( l ,r );

        qu.push(root);
    }

    HuffmanTree *root = qu.top();

    string code = "";
    fun( root, code );
    del( root );
}